

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O0

string * __thiscall
cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmExternalMakefileProjectGeneratorFactory *this)

{
  cmExternalMakefileProjectGeneratorFactory *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Name);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGeneratorFactory::GetName() const
{
  return this->Name;
}